

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O1

bool __thiscall
DepsLog::RecordDeps(DepsLog *this,Node *node,TimeStamp mtime,int node_count,Node **nodes)

{
  uint uVar1;
  pointer ppDVar2;
  TimeStamp TVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int *piVar7;
  size_t sVar8;
  Deps *pDVar9;
  Node **ppNVar10;
  ulong uVar11;
  int id;
  uint32_t mtime_part;
  uint size;
  int local_44;
  undefined4 local_40;
  uint local_3c;
  TimeStamp local_38;
  
  if (node->id_ < 0) {
    bVar4 = RecordId(this,node);
    bVar5 = true;
    if (!bVar4) {
      return false;
    }
  }
  else {
    bVar5 = false;
  }
  local_38 = mtime;
  if (0 < node_count) {
    uVar11 = 0;
    do {
      if (nodes[uVar11]->id_ < 0) {
        bVar4 = RecordId(this,nodes[uVar11]);
        bVar5 = true;
        if (!bVar4) {
          return false;
        }
      }
      uVar11 = uVar11 + 1;
    } while ((uint)node_count != uVar11);
  }
  TVar3 = local_38;
  if (!bVar5) {
    iVar6 = node->id_;
    if (((long)iVar6 < 0) ||
       (ppDVar2 = (this->deps_).
                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
       (int)((ulong)((long)(this->deps_).
                           super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar2) >> 3) <= iVar6
       )) {
      pDVar9 = (Deps *)0x0;
    }
    else {
      pDVar9 = ppDVar2[iVar6];
    }
    if (((pDVar9 == (Deps *)0x0) || (pDVar9->mtime != local_38)) ||
       (pDVar9->node_count != node_count)) {
LAB_0011143c:
      bVar5 = true;
    }
    else if (0 < node_count) {
      uVar11 = 0;
      do {
        if (pDVar9->nodes[uVar11] != nodes[uVar11]) goto LAB_0011143c;
        uVar11 = uVar11 + 1;
      } while ((uint)node_count != uVar11);
    }
  }
  if (!bVar5) {
    return true;
  }
  uVar1 = node_count * 4 + 0xc;
  local_3c = uVar1;
  if (uVar1 < 0x80000) {
    bVar5 = OpenForWriteIfNeeded(this);
    if (bVar5) {
      local_3c = uVar1 | 0x80000000;
      sVar8 = fwrite(&local_3c,4,1,(FILE *)this->file_);
      if (sVar8 != 0) {
        local_44 = node->id_;
        sVar8 = fwrite(&local_44,4,1,(FILE *)this->file_);
        if (sVar8 != 0) {
          local_40 = (undefined4)TVar3;
          sVar8 = fwrite(&local_40,4,1,(FILE *)this->file_);
          if (sVar8 != 0) {
            local_40 = (undefined4)((ulong)TVar3 >> 0x20);
            sVar8 = fwrite(&local_40,4,1,(FILE *)this->file_);
            if (sVar8 != 0) {
              if (0 < node_count) {
                uVar11 = 0;
                do {
                  local_44 = nodes[uVar11]->id_;
                  sVar8 = fwrite(&local_44,4,1,(FILE *)this->file_);
                  if (sVar8 == 0) {
                    return false;
                  }
                  uVar11 = uVar11 + 1;
                } while ((uint)node_count != uVar11);
              }
              iVar6 = fflush((FILE *)this->file_);
              if (iVar6 == 0) {
                pDVar9 = (Deps *)operator_new(0x18);
                pDVar9->mtime = local_38;
                pDVar9->node_count = node_count;
                uVar11 = 0xffffffffffffffff;
                if (-1 < node_count) {
                  uVar11 = (long)node_count << 3;
                }
                ppNVar10 = (Node **)operator_new__(uVar11);
                pDVar9->nodes = ppNVar10;
                if (0 < node_count) {
                  uVar11 = 0;
                  do {
                    pDVar9->nodes[uVar11] = nodes[uVar11];
                    uVar11 = uVar11 + 1;
                  } while ((uint)node_count != uVar11);
                }
                UpdateDeps(this,node->id_,pDVar9);
                return true;
              }
            }
          }
        }
      }
    }
  }
  else {
    piVar7 = __errno_location();
    *piVar7 = 0x22;
  }
  return false;
}

Assistant:

bool DepsLog::RecordDeps(Node* node, TimeStamp mtime,
                         int node_count, Node** nodes) {
  // Track whether there's any new data to be recorded.
  bool made_change = false;

  // Assign ids to all nodes that are missing one.
  if (node->id() < 0) {
    if (!RecordId(node))
      return false;
    made_change = true;
  }
  for (int i = 0; i < node_count; ++i) {
    if (nodes[i]->id() < 0) {
      if (!RecordId(nodes[i]))
        return false;
      made_change = true;
    }
  }

  // See if the new data is different than the existing data, if any.
  if (!made_change) {
    Deps* deps = GetDeps(node);
    if (!deps ||
        deps->mtime != mtime ||
        deps->node_count != node_count) {
      made_change = true;
    } else {
      for (int i = 0; i < node_count; ++i) {
        if (deps->nodes[i] != nodes[i]) {
          made_change = true;
          break;
        }
      }
    }
  }

  // Don't write anything if there's no new info.
  if (!made_change)
    return true;

  // Update on-disk representation.
  unsigned size = 4 * (1 + 2 + node_count);
  if (size > kMaxRecordSize) {
    errno = ERANGE;
    return false;
  }

  if (!OpenForWriteIfNeeded()) {
    return false;
  }
  size |= 0x80000000;  // Deps record: set high bit.
  if (fwrite(&size, 4, 1, file_) < 1)
    return false;
  int id = node->id();
  if (fwrite(&id, 4, 1, file_) < 1)
    return false;
  uint32_t mtime_part = static_cast<uint32_t>(mtime & 0xffffffff);
  if (fwrite(&mtime_part, 4, 1, file_) < 1)
    return false;
  mtime_part = static_cast<uint32_t>((mtime >> 32) & 0xffffffff);
  if (fwrite(&mtime_part, 4, 1, file_) < 1)
    return false;
  for (int i = 0; i < node_count; ++i) {
    id = nodes[i]->id();
    if (fwrite(&id, 4, 1, file_) < 1)
      return false;
  }
  if (fflush(file_) != 0)
    return false;

  // Update in-memory representation.
  Deps* deps = new Deps(mtime, node_count);
  for (int i = 0; i < node_count; ++i)
    deps->nodes[i] = nodes[i];
  UpdateDeps(node->id(), deps);

  return true;
}